

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

int cuddResizeTableZdd(DdManager *unique,int index)

{
  uint value;
  int iVar1;
  int iVar2;
  DdNode **ppDVar3;
  DdSubtable *pDVar4;
  int *piVar5;
  int *piVar6;
  int local_60;
  int *newinvperm;
  int *newperm;
  uint numSlots;
  int reorderSave;
  int j;
  int i;
  int newsize;
  int oldsize;
  DdNodePtr *newnodelist;
  DdSubtable *newsubtables;
  int index_local;
  DdManager *unique_local;
  
  value = unique->initSlots;
  iVar1 = unique->sizeZ;
  reorderSave = iVar1;
  if (index < unique->maxSizeZ) {
    for (; reorderSave <= index; reorderSave = reorderSave + 1) {
      unique->subtableZ[reorderSave].slots = value;
      iVar1 = cuddComputeFloorLog2(value);
      unique->subtableZ[reorderSave].shift = 0x20 - iVar1;
      unique->subtableZ[reorderSave].keys = 0;
      unique->subtableZ[reorderSave].maxKeys = value << 2;
      unique->subtableZ[reorderSave].dead = 0;
      unique->permZ[reorderSave] = reorderSave;
      unique->invpermZ[reorderSave] = reorderSave;
      ppDVar3 = (DdNode **)malloc((ulong)value << 3);
      unique->subtableZ[reorderSave].nodelist = ppDVar3;
      if (ppDVar3 == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      for (numSlots = 0; numSlots < value; numSlots = numSlots + 1) {
        ppDVar3[(int)numSlots] = (DdNode *)0x0;
      }
    }
  }
  else {
    iVar2 = index + 10;
    pDVar4 = (DdSubtable *)malloc((long)iVar2 * 0x38);
    if (pDVar4 == (DdSubtable *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    piVar5 = (int *)malloc((long)iVar2 << 2);
    if (piVar5 == (int *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    piVar6 = (int *)malloc((long)iVar2 << 2);
    if (piVar6 == (int *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    unique->memused =
         (long)(iVar2 - unique->maxSizeZ) * ((ulong)(value + 1) * 8 + 0x40) + unique->memused;
    if (unique->maxSize < iVar2) {
      if (unique->stack != (DdNode **)0x0) {
        free(unique->stack);
        unique->stack = (DdNode **)0x0;
      }
      ppDVar3 = (DdNode **)malloc((long)(index + 0xb) << 3);
      unique->stack = ppDVar3;
      if (unique->stack == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      *unique->stack = (DdNode *)0x0;
      if (unique->maxSize < unique->maxSizeZ) {
        local_60 = unique->maxSizeZ;
      }
      else {
        local_60 = unique->maxSize;
      }
      unique->memused = (long)(iVar2 - local_60) * 8 + unique->memused;
    }
    for (reorderSave = 0; reorderSave < iVar1; reorderSave = reorderSave + 1) {
      pDVar4[reorderSave].slots = unique->subtableZ[reorderSave].slots;
      pDVar4[reorderSave].shift = unique->subtableZ[reorderSave].shift;
      pDVar4[reorderSave].keys = unique->subtableZ[reorderSave].keys;
      pDVar4[reorderSave].maxKeys = unique->subtableZ[reorderSave].maxKeys;
      pDVar4[reorderSave].dead = unique->subtableZ[reorderSave].dead;
      pDVar4[reorderSave].nodelist = unique->subtableZ[reorderSave].nodelist;
      piVar5[reorderSave] = unique->permZ[reorderSave];
      piVar6[reorderSave] = unique->invpermZ[reorderSave];
    }
    while (reorderSave = iVar1, reorderSave <= index) {
      pDVar4[reorderSave].slots = value;
      iVar1 = cuddComputeFloorLog2(value);
      pDVar4[reorderSave].shift = 0x20 - iVar1;
      pDVar4[reorderSave].keys = 0;
      pDVar4[reorderSave].maxKeys = value << 2;
      pDVar4[reorderSave].dead = 0;
      piVar5[reorderSave] = reorderSave;
      piVar6[reorderSave] = reorderSave;
      ppDVar3 = (DdNode **)malloc((ulong)value << 3);
      pDVar4[reorderSave].nodelist = ppDVar3;
      if (ppDVar3 == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      for (numSlots = 0; numSlots < value; numSlots = numSlots + 1) {
        ppDVar3[(int)numSlots] = (DdNode *)0x0;
      }
      iVar1 = reorderSave + 1;
    }
    if (unique->subtableZ != (DdSubtable *)0x0) {
      free(unique->subtableZ);
      unique->subtableZ = (DdSubtable *)0x0;
    }
    unique->subtableZ = pDVar4;
    unique->maxSizeZ = iVar2;
    if (unique->permZ != (int *)0x0) {
      free(unique->permZ);
      unique->permZ = (int *)0x0;
    }
    unique->permZ = piVar5;
    if (unique->invpermZ != (int *)0x0) {
      free(unique->invpermZ);
      unique->invpermZ = (int *)0x0;
    }
    unique->invpermZ = piVar6;
  }
  unique->slots = ((index + 1) - unique->sizeZ) * value + unique->slots;
  ddFixLimits(unique);
  unique->sizeZ = index + 1;
  iVar1 = unique->autoDynZ;
  unique->autoDynZ = 0;
  cuddZddFreeUniv(unique);
  iVar2 = cuddZddInitUniv(unique);
  if (iVar2 != 0) {
    unique->autoDynZ = iVar1;
  }
  else {
    unique->autoDynZ = iVar1;
  }
  unique_local._4_4_ = (uint)(iVar2 != 0);
  return unique_local._4_4_;
}

Assistant:

int
cuddResizeTableZdd(
  DdManager * unique,
  int  index)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    int oldsize,newsize;
    int i,j,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm;

    oldsize = unique->sizeZ;
    /* Easy case: there is still room in the current table. */
    if (index < unique->maxSizeZ) {
        for (i = oldsize; i <= index; i++) {
            unique->subtableZ[i].slots = numSlots;
            unique->subtableZ[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtableZ[i].keys = 0;
            unique->subtableZ[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtableZ[i].dead = 0;
            unique->permZ[i] = i;
            unique->invpermZ[i] = i;
            newnodelist = unique->subtableZ[i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables up to index included.
        */
        newsize = index + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the ZDD table size from %d to %d\n",
            unique->maxSizeZ, newsize);
#endif
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        unique->memused += (newsize - unique->maxSizeZ) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        if (newsize > unique->maxSize) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
        for (i = 0; i < oldsize; i++) {
            newsubtables[i].slots = unique->subtableZ[i].slots;
            newsubtables[i].shift = unique->subtableZ[i].shift;
            newsubtables[i].keys = unique->subtableZ[i].keys;
            newsubtables[i].maxKeys = unique->subtableZ[i].maxKeys;
            newsubtables[i].dead = unique->subtableZ[i].dead;
            newsubtables[i].nodelist = unique->subtableZ[i].nodelist;
            newperm[i] = unique->permZ[i];
            newinvperm[i] = unique->invpermZ[i];
        }
        for (i = oldsize; i <= index; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newperm[i] = i;
            newinvperm[i] = i;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
        ABC_FREE(unique->subtableZ);
        unique->subtableZ = newsubtables;
        unique->maxSizeZ = newsize;
        ABC_FREE(unique->permZ);
        unique->permZ = newperm;
        ABC_FREE(unique->invpermZ);
        unique->invpermZ = newinvperm;
    }
    unique->slots += (index + 1 - unique->sizeZ) * numSlots;
    ddFixLimits(unique);
    unique->sizeZ = index + 1;

    /* Now that the table is in a coherent state, update the ZDD
    ** universe. We need to temporarily disable reordering,
    ** because we cannot reorder without universe in place.
    */

    reorderSave = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    if (!cuddZddInitUniv(unique)) {
        unique->autoDynZ = reorderSave;
        return(0);
    }
    unique->autoDynZ = reorderSave;

    return(1);

}